

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

void Opcode::AABBCollisionTree::Walk(bool(*)(void_const*,void*),void*)::
     AABBCollisionNode_const__bool_____void_const__void___void__
               (AABBCollisionNode *current_node,GenericWalkingCallback callback,void *user_data)

{
  bool bVar1;
  void *user_data_local;
  GenericWalkingCallback callback_local;
  AABBCollisionNode *current_node_local;
  
  if (((current_node != (AABBCollisionNode *)0x0) &&
      (bVar1 = (*callback)(current_node,user_data), bVar1)) && ((current_node->mData & 1) == 0)) {
    AABBCollisionNode_const__bool_____void_const__void___void__
              ((AABBCollisionNode *)current_node->mData,callback,user_data);
    AABBCollisionNode_const__bool_____void_const__void___void__
              ((AABBCollisionNode *)(current_node->mData + 0x20),callback,user_data);
  }
  return;
}

Assistant:

static void _Walk(const AABBCollisionNode* current_node, GenericWalkingCallback callback, void* user_data)
		{
			if(!current_node || !(callback)(current_node, user_data))	return;

			if(!current_node->IsLeaf())
			{
				_Walk(current_node->GetPos(), callback, user_data);
				_Walk(current_node->GetNeg(), callback, user_data);
			}
		}